

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

string * cmsys::SystemTools::CropString(string *__return_storage_ptr__,string *s,size_t max_len)

{
  pointer pcVar1;
  ulong uVar2;
  long *local_50 [2];
  long local_40 [2];
  
  uVar2 = s->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (max_len == 0 || uVar2 <= max_len) {
    pcVar1 = (s->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + uVar2);
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    uVar2 = max_len >> 1;
    std::__cxx11::string::substr((ulong)local_50,(ulong)s);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)s);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (((2 < max_len) && ((__return_storage_ptr__->_M_dataplus)._M_p[uVar2] = '.', max_len != 3))
       && ((__return_storage_ptr__->_M_dataplus)._M_p[uVar2 - 1] = '.', 4 < max_len)) {
      (__return_storage_ptr__->_M_dataplus)._M_p[uVar2 + 1] = '.';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SystemTools::CropString(const kwsys_stl::string& s,
                                          size_t max_len)
{
  if (!s.size() || max_len == 0 || max_len >= s.size())
    {
    return s;
    }

  kwsys_stl::string n;
  n.reserve(max_len);

  size_t middle = max_len / 2;

  n += s.substr(0, middle);
  n += s.substr(s.size() - (max_len - middle), kwsys_stl::string::npos);

  if (max_len > 2)
    {
    n[middle] = '.';
    if (max_len > 3)
      {
      n[middle - 1] = '.';
      if (max_len > 4)
        {
        n[middle + 1] = '.';
        }
      }
    }

  return n;
}